

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::concat<kj::_::Delimited<kj::ArrayPtr<kj::String_const>>>
          (String *__return_storage_ptr__,_ *this,Delimited<kj::ArrayPtr<const_kj::String>_> *params
          )

{
  size_t size;
  char *target;
  Delimited<kj::ArrayPtr<const_kj::String>_> *pDVar1;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  Delimited<kj::ArrayPtr<const_kj::String>_> local_80;
  size_t local_38;
  _ *local_30;
  undefined8 local_28;
  undefined1 local_19;
  NoInfer<kj::_::Delimited<kj::ArrayPtr<const_kj::String>_>_> *local_18;
  Delimited<kj::ArrayPtr<const_kj::String>_> *params_local;
  String *result;
  
  local_19 = 0;
  local_18 = (NoInfer<kj::_::Delimited<kj::ArrayPtr<const_kj::String>_>_> *)this;
  params_local = (Delimited<kj::ArrayPtr<const_kj::String>_> *)__return_storage_ptr__;
  local_38 = Delimited<kj::ArrayPtr<const_kj::String>_>::size
                       ((Delimited<kj::ArrayPtr<const_kj::String>_> *)this);
  local_30 = (_ *)&local_38;
  local_28 = 1;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x1;
  size = sum(local_30,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  pDVar1 = fwd<kj::_::Delimited<kj::ArrayPtr<kj::String_const>>>(local_18);
  Delimited<kj::ArrayPtr<const_kj::String>_>::Delimited(&local_80,pDVar1);
  fill<kj::ArrayPtr<kj::String_const>>(target,&local_80);
  Delimited<kj::ArrayPtr<const_kj::String>_>::~Delimited(&local_80);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}